

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

plutovg_path_element_t *
plutovg_path_add_command(plutovg_path_t *path,plutovg_path_command_t command,int npoints)

{
  int iVar1;
  plutovg_path_element_t *ppVar2;
  int local_34;
  plutovg_path_element_t *elements;
  int newcapacity;
  int capacity;
  int length;
  int npoints_local;
  plutovg_path_command_t command_local;
  plutovg_path_t *path_local;
  
  iVar1 = npoints + 1;
  if ((path->elements).capacity < (path->elements).size + iVar1) {
    if ((path->elements).capacity == 0) {
      local_34 = 8;
    }
    else {
      local_34 = (path->elements).capacity;
    }
    for (elements._4_4_ = local_34; elements._4_4_ < (path->elements).size + iVar1;
        elements._4_4_ = elements._4_4_ << 1) {
    }
    ppVar2 = (plutovg_path_element_t *)realloc((path->elements).data,(long)elements._4_4_ << 3);
    (path->elements).data = ppVar2;
    (path->elements).capacity = elements._4_4_;
  }
  ppVar2 = (path->elements).data + (path->elements).size;
  (ppVar2->header).command = command;
  *(int *)((long)ppVar2 + 4) = iVar1;
  (path->elements).size = iVar1 + (path->elements).size;
  path->num_points = npoints + path->num_points;
  return ppVar2 + 1;
}

Assistant:

static plutovg_path_element_t* plutovg_path_add_command(plutovg_path_t* path, plutovg_path_command_t command, int npoints)
{
    const int length = npoints + 1;
    plutovg_array_ensure(path->elements, length);
    plutovg_path_element_t* elements = path->elements.data + path->elements.size;
    elements->header.command = command;
    elements->header.length = length;
    path->elements.size += length;
    path->num_points += npoints;
    return elements + 1;
}